

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_aug.c
# Opt level: O0

int compute_transparency(png *z,uint8 *tc,int out_n)

{
  uint8 uVar1;
  uint uVar2;
  uint8 *p;
  uint32 pixel_count;
  uint32 i;
  stbi *s;
  int out_n_local;
  uint8 *tc_local;
  png *z_local;
  
  uVar2 = (z->s).img_x * (z->s).img_y;
  p = z->out;
  if (out_n == 2) {
    for (i = 0; i < uVar2; i = i + 1) {
      uVar1 = 0xff;
      if (*p == *tc) {
        uVar1 = '\0';
      }
      p[1] = uVar1;
      p = p + 2;
    }
  }
  else {
    for (i = 0; i < uVar2; i = i + 1) {
      if (((*p == *tc) && (p[1] == tc[1])) && (p[2] == tc[2])) {
        p[3] = '\0';
      }
      p = p + 4;
    }
  }
  return 1;
}

Assistant:

static int compute_transparency(png *z, uint8 tc[3], int out_n)
{
   stbi *s = &z->s;
   uint32 i, pixel_count = s->img_x * s->img_y;
   uint8 *p = z->out;

   // compute color-based transparency, assuming we've
   // already got 255 as the alpha value in the output
   assert(out_n == 2 || out_n == 4);

   if (out_n == 2) {
      for (i=0; i < pixel_count; ++i) {
         p[1] = (p[0] == tc[0] ? 0 : 255);
         p += 2;
      }
   } else {
      for (i=0; i < pixel_count; ++i) {
         if (p[0] == tc[0] && p[1] == tc[1] && p[2] == tc[2])
            p[3] = 0;
         p += 4;
      }
   }
   return 1;
}